

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_level_changer::cse_alife_level_changer(cse_alife_level_changer *this)

{
  cse_alife_level_changer *this_local;
  
  cse_alife_space_restrictor::cse_alife_space_restrictor(&this->super_cse_alife_space_restrictor);
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract._vptr_cse_abstract = (_func_int **)&PTR__cse_alife_level_changer_0038a498;
  (this->super_cse_alife_space_restrictor).super_cse_shape._vptr_cse_shape =
       (_func_int **)&PTR__cse_alife_level_changer_0038a500;
  *(undefined2 *)&(this->super_cse_alife_space_restrictor).field_0x13a = 0xffff;
  *(undefined4 *)&(this->super_cse_alife_space_restrictor).field_0x13c = 0xffffffff;
  std::__cxx11::string::string((string *)&this->m_level_to_change);
  std::__cxx11::string::string((string *)&this->m_level_point_to_change);
  this->m_silent_mode = false;
  _vector3<float>::set(&this->m_next_position,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_angles,0.0,0.0,0.0);
  return;
}

Assistant:

cse_alife_level_changer::cse_alife_level_changer():
	m_next_graph_id(UNDEF16), m_next_node_id(UNDEF32),
	m_silent_mode(false)
{
	m_next_position.set();
	m_angles.set();
}